

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

int Aig_ManScanMapping_rec(Cnf_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vMapped)

{
  int iVar1;
  ulong uVar2;
  Vec_Ptr_t *vSuper;
  Aig_Obj_t *pObj_00;
  uint uVar3;
  int iVar4;
  int i;
  void *pvVar5;
  
  uVar2 = *(ulong *)&pObj->field_0x18;
  *(ulong *)&pObj->field_0x18 =
       uVar2 & 0xffffffff0000003f | (ulong)((uint)uVar2 + 0x40 & 0xffffffc0);
  iVar4 = 0;
  if (((uint)uVar2 & 7) != 2 && (uVar2 & 0xffffffc0) == 0) {
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      uVar2 = *(ulong *)&pObj->field_0x18;
      if (((uint)uVar2 & 7) != 5) {
        __assert_fail("Aig_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfUtil.c"
                      ,0x35,"int Aig_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      if (vMapped != (Vec_Ptr_t *)0x0) {
        Vec_PtrPush(vMapped,pObj);
        uVar2 = *(ulong *)&pObj->field_0x18;
      }
      if ((uVar2 & 0x20) == 0) {
        pvVar5 = (pObj->field_5).pData;
        uVar2 = uVar2 >> 0x38;
        while (iVar4 = (int)uVar2, uVar2 = (ulong)(iVar4 - 1), iVar4 != 0) {
          uVar3 = *(uint *)((long)pvVar5 + 4);
          if ((~*(uint *)((long)pvVar5 + 4) & 0x18000000) == 0) goto LAB_0046d5dd;
          pvVar5 = (void *)((long)pvVar5 + 0x18);
        }
        pvVar5 = (void *)0x0;
        uVar3 = _DAT_00000004;
LAB_0046d5dd:
        iVar4 = (int)p->pSopSizes[(ulong)(uVar3 & 0xffff) ^ 0xffff] +
                (int)p->pSopSizes[uVar3 & 0xffff];
        for (uVar2 = 0; uVar2 < uVar3 >> 0x1d; uVar2 = uVar2 + 1) {
          pObj_00 = Aig_ManObj(p->pManAig,*(int *)((long)pvVar5 + uVar2 * 4 + 8));
          iVar1 = Aig_ManScanMapping_rec(p,pObj_00,vMapped);
          iVar4 = iVar4 + iVar1;
          uVar3 = *(uint *)((long)pvVar5 + 4);
        }
      }
      else {
        vSuper = Vec_PtrAlloc(100);
        Aig_ObjCollectSuper(pObj,vSuper);
        iVar1 = vSuper->nSize;
        iVar4 = iVar1 + 1;
        for (i = 0; i < iVar1; i = i + 1) {
          pvVar5 = Vec_PtrEntry(vSuper,i);
          iVar1 = Aig_ManScanMapping_rec
                            (p,(Aig_Obj_t *)((ulong)pvVar5 & 0xfffffffffffffffe),vMapped);
          iVar4 = iVar4 + iVar1;
          iVar1 = vSuper->nSize;
        }
        Vec_PtrFree(vSuper);
        pObj->field_0x18 = pObj->field_0x18 | 0x20;
      }
    }
  }
  return iVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area, references, and nodes used in the mapping.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManScanMapping_rec( Cnf_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pLeaf;
    Dar_Cut_t * pCutBest;
    int aArea, i;
    if ( pObj->nRefs++ || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    assert( Aig_ObjIsAnd(pObj) );
    // collect the node first to derive pre-order
    if ( vMapped )
        Vec_PtrPush( vMapped, pObj );
    // visit the transitive fanin of the selected cut
    if ( pObj->fMarkB )
    {
        Vec_Ptr_t * vSuper = Vec_PtrAlloc( 100 );
        Aig_ObjCollectSuper( pObj, vSuper );
        aArea = Vec_PtrSize(vSuper) + 1;
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, Aig_Regular(pLeaf), vMapped );
        Vec_PtrFree( vSuper );
        ////////////////////////////
        pObj->fMarkB = 1;
    }
    else
    {
        pCutBest = Dar_ObjBestCut( pObj );
        aArea = Cnf_CutSopCost( p, pCutBest );
        Dar_CutForEachLeaf( p->pManAig, pCutBest, pLeaf, i )
            aArea += Aig_ManScanMapping_rec( p, pLeaf, vMapped );
    }
    return aArea;
}